

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceImage::RunIteration
          (BasicResourceImage *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  GLuint GVar6;
  GLint GVar7;
  uint uVar8;
  uint uVar9;
  int width;
  int height;
  uint num_groups_z;
  int iVar10;
  ulong __n;
  reference pvVar11;
  uint *data_00;
  float *pfVar12;
  CallLogWrapper *this_01;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 local_c4 [8];
  vec4 c;
  int x;
  int y;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  int i;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint kSize;
  GLint kDepth;
  GLint kHeight;
  GLint kWidth;
  string local_50;
  byte local_29;
  uvec3 *puStack_28;
  bool dispatch_indirect_local;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicResourceImage *this_local;
  
  local_29 = dispatch_indirect;
  puStack_28 = num_groups;
  num_groups_local = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  gl4cts::(anonymous_namespace)::BasicResourceImage::GenSource_abi_cxx11_
            (&local_50,this,num_groups_local,puStack_28);
  GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar6;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar5 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar5) {
    this_01 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_01,this->m_program);
    GVar7 = glu::CallLogWrapper::glGetUniformLocation(this_01,this->m_program,"g_image1");
    glu::CallLogWrapper::glUniform1i(this_01,GVar7,0);
    GVar7 = glu::CallLogWrapper::glGetUniformLocation(this_01,this->m_program,"g_image2");
    glu::CallLogWrapper::glUniform1i(this_01,GVar7,1);
    glu::CallLogWrapper::glUseProgram(this_01,0);
    uVar8 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
    uVar9 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
    width = uVar8 * uVar9;
    uVar8 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
    uVar9 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
    height = uVar8 * uVar9;
    uVar8 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
    uVar9 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = width * height * uVar8 * uVar9;
    __n = (ulong)data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    this_00 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&display.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,__n,
               this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&display.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,this->m_texture);
    }
    for (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)display.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage < 2;
        display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)display.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,
                 this->m_texture
                 [(int)display.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage]);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2801,0x2601);
      pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&i,0);
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0,0x8814,width,height,0,0x1908,0x1406,pvVar11);
    }
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,this->m_texture[0],0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,this->m_texture[1],0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    if ((local_29 & 1) == 0) {
      uVar8 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar9 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      num_groups_z = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,uVar8,uVar9,num_groups_z);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      data_00 = tcu::Vector<unsigned_int,_3>::operator[](puStack_28,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,data_00,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x20);
    glu::CallLogWrapper::glClear
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[0]);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vertex_array);
    glu::CallLogWrapper::glViewport
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,width,height);
    glu::CallLogWrapper::glDrawArraysInstanced
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4,1);
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&x + 3));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y,
               (long)(width * height),(allocator<tcu::Vector<float,_4>_> *)((long)&x + 3));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&x + 3));
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &y,0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,width,height,0x1908,0x1406,pvVar11);
    for (c.m_data[3] = 0.0; (int)c.m_data[3] < height; c.m_data[3] = (float)((int)c.m_data[3] + 1))
    {
      for (c.m_data[2] = 0.0; fVar1 = c.m_data[3], (int)c.m_data[2] < width;
          c.m_data[2] = (float)((int)c.m_data[2] + 1)) {
        iVar10 = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
        fVar2 = c.m_data[2];
        if (((int)fVar1 < iVar10) &&
           (iVar10 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase),
           (int)fVar2 < iVar10)) {
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)local_c4,
                     (float)((int)c.m_data[3] + (int)c.m_data[2]) / 255.0);
          pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)&y,(long)((int)c.m_data[3] * width + (int)c.m_data[2]));
          bVar5 = ComputeShaderBase::ColorEqual
                            (&this->super_ComputeShaderBase,pvVar11,(vec4 *)local_c4,
                             &(this->super_ComputeShaderBase).g_color_eps);
          if (!bVar5) {
            pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)&y,(long)((int)c.m_data[3] * width + (int)c.m_data[2]));
            pfVar12 = tcu::Vector<float,_4>::x(pvVar11);
            fVar1 = *pfVar12;
            pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)&y,(long)((int)c.m_data[3] * width + (int)c.m_data[2]));
            pfVar12 = tcu::Vector<float,_4>::y(pvVar11);
            fVar2 = *pfVar12;
            pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)&y,(long)((int)c.m_data[3] * width + (int)c.m_data[2]));
            pfVar12 = tcu::Vector<float,_4>::z(pvVar11);
            fVar3 = *pfVar12;
            pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)&y,(long)((int)c.m_data[3] * width + (int)c.m_data[2]));
            pfVar12 = tcu::Vector<float,_4>::w(pvVar11);
            fVar4 = *pfVar12;
            fVar13 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_c4);
            fVar14 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_c4);
            fVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_c4);
            fVar16 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_c4);
            anon_unknown_0::Output
                      ("Got %f, %f, %f, %f, expected %f, %f, %f, %f at %d, %d",(double)fVar1,
                       (double)fVar2,(double)fVar3,(double)fVar4,(double)fVar13,(double)fVar14,
                       (double)fVar15,(double)fVar16,(ulong)(uint)c.m_data[2],
                       (ulong)(uint)c.m_data[3]);
            this_local._7_1_ = 0;
            goto LAB_00f6c1b8;
          }
        }
      }
    }
    this_local._7_1_ = 1;
LAB_00f6c1b8:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_image1"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_image2"), 1);
		glUseProgram(0);

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		std::vector<vec4> data(kSize);
		if (m_texture[0] == 0)
			glGenTextures(2, m_texture);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glClear(GL_COLOR_BUFFER_BIT);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_vertex_array);
		glViewport(0, 0, kWidth, kHeight);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		std::vector<vec4> display(kWidth * kHeight);
		glReadPixels(0, 0, kWidth, kHeight, GL_RGBA, GL_FLOAT, &display[0]);

		for (int y = 0; y < kHeight; ++y)
		{
			for (int x = 0; x < kWidth; ++x)
			{
				if (y >= getWindowHeight() || x >= getWindowWidth())
				{
					continue;
				}
				const vec4 c = vec4(float(y + x) / 255.0f);
				if (!ColorEqual(display[y * kWidth + x], c, g_color_eps))
				{
					Output("Got %f, %f, %f, %f, expected %f, %f, %f, %f at %d, %d", display[y * kWidth + x].x(),
						   display[y * kWidth + x].y(), display[y * kWidth + x].z(), display[y * kWidth + x].w(), c.x(),
						   c.y(), c.z(), c.w(), x, y);
					return false;
				}
			}
		}

		return true;
	}